

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iSWAP.cpp
# Opt level: O2

void test_qclab_qgates_iSWAP_check<std::complex<float>>
               (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *v1,
               vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *v2)

{
  pointer pcVar1;
  pointer pcVar2;
  double unaff_RBX;
  ulong uVar3;
  char *pcVar4;
  double unaff_R12;
  char *in_stack_ffffffffffffffa8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_ffffffffffffffb0;
  AssertionResult gtest_ar;
  AssertHelper in_stack_ffffffffffffffc8;
  
  pcVar1 = (v1->super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pcVar2 = (v1->super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if ((long)pcVar2 - (long)pcVar1 ==
      (long)(v2->super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>).
            _M_impl.super__Vector_impl_data._M_finish -
      (long)(v2->super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>).
            _M_impl.super__Vector_impl_data._M_start) {
    for (uVar3 = 0; uVar3 < (ulong)((long)pcVar2 - (long)pcVar1 >> 3); uVar3 = uVar3 + 1) {
      testing::internal::DoubleNearPredFormat
                ((char *)in_stack_ffffffffffffffb0._M_head_impl,in_stack_ffffffffffffffa8,
                 (char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_),unaff_R12,unaff_RBX,
                 (double)in_stack_ffffffffffffffc8.data_);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&stack0xffffffffffffffb0);
        pcVar4 = "";
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar4 = *(char **)gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xffffffffffffffc8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
                   ,0x10,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xffffffffffffffc8,(Message *)&stack0xffffffffffffffb0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffc8);
        if (in_stack_ffffffffffffffb0._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)in_stack_ffffffffffffffb0._M_head_impl + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      testing::internal::DoubleNearPredFormat
                ((char *)in_stack_ffffffffffffffb0._M_head_impl,in_stack_ffffffffffffffa8,
                 (char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_),unaff_R12,unaff_RBX,
                 (double)in_stack_ffffffffffffffc8.data_);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&stack0xffffffffffffffb0);
        pcVar4 = "";
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar4 = *(char **)gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xffffffffffffffc8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
                   ,0x11,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xffffffffffffffc8,(Message *)&stack0xffffffffffffffb0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffc8);
        if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             )in_stack_ffffffffffffffb0._M_head_impl !=
            (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             )0x0) {
          (**(code **)(*(long *)in_stack_ffffffffffffffb0._M_head_impl + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      pcVar1 = (v1->super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      pcVar2 = (v1->super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>).
               _M_impl.super__Vector_impl_data._M_finish;
    }
    return;
  }
  __assert_fail("v1.size() == v2.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
                ,9,
                "void test_qclab_qgates_iSWAP_check(const std::vector<T> &, const std::vector<T> &) [T = std::complex<float>]"
               );
}

Assistant:

void test_qclab_qgates_iSWAP_check( const std::vector< T >& v1 ,
                                    const std::vector< T >& v2 ) {

  assert( v1.size() == v2.size() ) ;

  using R = qclab::real_t< T > ;
  const R eps = std::numeric_limits< R >::epsilon() ;
  const R tol = 100 * eps ;

  for ( size_t i = 0; i < v1.size(); i++ ) {
    EXPECT_NEAR( std::real( v1[i] ) , std::real( v2[i] ) , tol ) ;
    EXPECT_NEAR( std::imag( v1[i] ) , std::imag( v2[i] ) , tol ) ;
  }

}